

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryVkImpl.cpp
# Opt level: O2

bool __thiscall Diligent::QueryVkImpl::AllocateQueries(QueryVkImpl *this)

{
  QueryManagerVk *pQVar1;
  char *pcVar2;
  Uint32 UVar3;
  DeviceContextVkImpl *pDVar4;
  char (*in_RCX) [23];
  char *Args_1;
  QUERY_TYPE Type;
  char (*in_R8) [54];
  char (*pacVar5) [45];
  string msg;
  char *local_38;
  
  DiscardQueries(this);
  if (this->m_pQueryMgr != (QueryManagerVk *)0x0) {
    FormatString<char[26],char[23]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pQueryMgr == nullptr"
               ,in_RCX);
    in_RCX = (char (*) [23])0x54;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"AllocateQueries",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
               ,0x54);
    std::__cxx11::string::~string((string *)&msg);
  }
  pDVar4 = (this->super_QueryBase<Diligent::EngineVkImplTraits>).m_pContext.m_pObject;
  if (pDVar4 == (DeviceContextVkImpl *)0x0) {
    FormatString<char[26],char[22]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pContext != nullptr",
               (char (*) [22])in_RCX);
    in_RCX = (char (*) [23])0x55;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"AllocateQueries",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
               ,0x55);
    std::__cxx11::string::~string((string *)&msg);
    pDVar4 = (this->super_QueryBase<Diligent::EngineVkImplTraits>).m_pContext.m_pObject;
  }
  pQVar1 = pDVar4->m_pQueryMgr;
  this->m_pQueryMgr = pQVar1;
  if (pQVar1 == (QueryManagerVk *)0x0) {
    FormatString<char[26],char[23]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pQueryMgr != nullptr"
               ,in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"AllocateQueries",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
               ,0x57);
    std::__cxx11::string::~string((string *)&msg);
  }
  pcVar2 = (char *)0x0;
  do {
    Args_1 = pcVar2;
    Type = (this->super_QueryBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
           .m_Desc.Type;
    pacVar5 = (char (*) [45])((ulong)(Type == QUERY_TYPE_DURATION) + 1);
    if (pacVar5 <= Args_1) goto LAB_002a94c3;
    if (*(int *)(&(this->super_QueryBase<Diligent::EngineVkImplTraits>).field_0x44 +
                (long)Args_1 * 4) != -1) {
      FormatString<char[26],char[45]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"QueryPoolIdx == QueryManagerVk::InvalidIndex",(char (*) [45])Args_1
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"AllocateQueries",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
                 ,0x5b);
      std::__cxx11::string::~string((string *)&msg);
      Type = (this->super_QueryBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
             .m_Desc.Type;
    }
    UVar3 = QueryManagerVk::AllocateQuery(this->m_pQueryMgr,Type);
    *(Uint32 *)
     (&(this->super_QueryBase<Diligent::EngineVkImplTraits>).field_0x44 + (long)Args_1 * 4) = UVar3;
    pcVar2 = Args_1 + 1;
  } while (UVar3 != 0xffffffff);
  local_38 = GetQueryTypeString((this->super_QueryBase<Diligent::EngineVkImplTraits>).
                                super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                                .m_Desc.Type);
  FormatString<char[42],char_const*,char[54]>
            (&msg,(Diligent *)"Failed to allocate Vulkan query for type ",(char (*) [42])&local_38,
             (char **)". Increase the query pool size in EngineVkCreateInfo.",in_R8);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
  }
  std::__cxx11::string::~string((string *)&msg);
  DiscardQueries(this);
LAB_002a94c3:
  return pacVar5 <= Args_1;
}

Assistant:

bool QueryVkImpl::AllocateQueries()
{
    DiscardQueries();

    VERIFY_EXPR(m_pQueryMgr == nullptr);
    VERIFY_EXPR(m_pContext != nullptr);
    m_pQueryMgr = m_pContext->GetQueryManager();
    VERIFY_EXPR(m_pQueryMgr != nullptr);
    for (Uint32 i = 0; i < (m_Desc.Type == QUERY_TYPE_DURATION ? Uint32{2} : Uint32{1}); ++i)
    {
        auto& QueryPoolIdx = m_QueryPoolIndex[i];
        VERIFY_EXPR(QueryPoolIdx == QueryManagerVk::InvalidIndex);

        QueryPoolIdx = m_pQueryMgr->AllocateQuery(m_Desc.Type);
        if (QueryPoolIdx == QueryManagerVk::InvalidIndex)
        {
            LOG_ERROR_MESSAGE("Failed to allocate Vulkan query for type ", GetQueryTypeString(m_Desc.Type),
                              ". Increase the query pool size in EngineVkCreateInfo.");
            DiscardQueries();
            return false;
        }
    }

    return true;
}